

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

string * __thiscall
cmScriptGenerator::CreateConfigTest
          (string *__return_storage_ptr__,cmScriptGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs)

{
  string *psVar1;
  string *config;
  string *config_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  char *local_28;
  
  local_40._M_str = (this->RuntimeConfigVariable)._M_dataplus._M_p;
  local_40._M_len = (this->RuntimeConfigVariable)._M_string_length;
  local_30 = 0xc;
  local_28 = " MATCHES \"^(";
  views._M_len = 2;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  psVar1 = (configs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (config_00 = (configs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; config_00 != psVar1;
      config_00 = config_00 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    cmScriptGeneratorEncodeConfig(config_00,__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmScriptGenerator::CreateConfigTest(
  std::vector<std::string> const& configs)
{
  std::string result = cmStrCat(this->RuntimeConfigVariable, " MATCHES \"^(");
  const char* sep = "";
  for (std::string const& config : configs) {
    result += sep;
    sep = "|";
    cmScriptGeneratorEncodeConfig(config, result);
  }
  result += ")$\"";
  return result;
}